

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

unsigned_short
capnp::(anonymous_namespace)::checkRoundTripFromFloat<unsigned_short,double>(double value)

{
  unsigned_short uVar1;
  DebugComparison<double_&,_double> _kjCondition;
  Fault f;
  double value_local;
  
  _kjCondition.right = 0.0;
  _kjCondition.op.content.ptr = " >= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = value >= 0.0;
  _kjCondition.left = &value_local;
  value_local = value;
  if (value < 0.0) {
    uVar1 = 0;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<double&,double>&,char_const(&)[39],double&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x6d8,FAILED,"value >= U(MIN)",
               "_kjCondition,\"Value out-of-range for requested type.\", value",&_kjCondition,
               (char (*) [39])"Value out-of-range for requested type.",&value_local);
  }
  else {
    _kjCondition.right = 65535.0;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = 65535.0 >= value;
    if (65535.0 < value) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<double&,double>&,char_const(&)[39],double&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x6db,FAILED,"value <= U(MAX)",
                 "_kjCondition,\"Value out-of-range for requested type.\", value",&_kjCondition,
                 (char (*) [39])"Value out-of-range for requested type.",&value_local);
      kj::_::Debug::Fault::~Fault(&f);
      uVar1 = 0xffff;
    }
    else {
      uVar1 = 0;
    }
    if (65535.0 < value) {
      return uVar1;
    }
    uVar1 = (unsigned_short)(int)value_local;
    _kjCondition.left = (double *)(double)((int)value_local & 0xffff);
    _kjCondition.result = (double)_kjCondition.left == value_local;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if ((value_local == (double)_kjCondition.left) &&
       (!NAN(value_local) && !NAN((double)_kjCondition.left))) {
      return uVar1;
    }
    _kjCondition.right = (double)&value_local;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<double,double&>&,char_const(&)[39],double&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x6df,FAILED,"U(result) == value",
               "_kjCondition,\"Value out-of-range for requested type.\", value",
               (DebugComparison<double,_double_&> *)&_kjCondition,
               (char (*) [39])"Value out-of-range for requested type.",&value_local);
  }
  kj::_::Debug::Fault::~Fault(&f);
  return uVar1;
}

Assistant:

T checkRoundTripFromFloat(U value) {
  // When `U` is `float` or `double`, we have to use a different approach, because casting an
  // out-of-range float to an integer is, surprisingly, UB.
  constexpr T MIN = kj::minValue;
  constexpr T MAX = kj::maxValue;
  KJ_REQUIRE(value >= U(MIN), "Value out-of-range for requested type.", value) {
    return MIN;
  }
  KJ_REQUIRE(value <= U(MAX), "Value out-of-range for requested type.", value) {
    return MAX;
  }
  T result = value;
  KJ_REQUIRE(U(result) == value, "Value out-of-range for requested type.", value) {
    // Use it anyway.
    break;
  }
  return result;
}